

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::CommissionerApp::OnJoinerRequest_abi_cxx11_
          (string *__return_storage_ptr__,CommissionerApp *this,ByteArray *aJoinerId)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_98;
  key_type local_90;
  _Base_ptr local_70;
  _Self local_68 [3];
  key_type local_50;
  _Self local_30;
  iterator joinerInfo;
  ByteArray *aJoinerId_local;
  CommissionerApp *this_local;
  string *pskd;
  
  joinerInfo._M_node._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_50.mType = kMeshCoP;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50.mId,aJoinerId);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
       ::find(&this->mJoiners,&local_50);
  JoinerKey::~JoinerKey(&local_50);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
       ::end(&this->mJoiners);
  bVar1 = std::operator!=(&local_30,local_68);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
             ::operator->(&local_30);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)&(ppVar2->second).mPSKd);
  }
  else {
    local_90.mType = kMeshCoP;
    Commissioner::ComputeJoinerId(&local_90.mId,0);
    local_70 = (_Base_ptr)
               std::
               map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
               ::find(&this->mJoiners,&local_90);
    local_30._M_node = local_70;
    JoinerKey::~JoinerKey(&local_90);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
         ::end(&this->mJoiners);
    bVar1 = std::operator!=(&local_30,&local_98);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
               ::operator->(&local_30);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)&(ppVar2->second).mPSKd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommissionerApp::OnJoinerRequest(const ByteArray &aJoinerId)
{
    std::string pskd;

    auto joinerInfo = mJoiners.find({JoinerType::kMeshCoP, aJoinerId});
    if (joinerInfo != mJoiners.end())
    {
        ExitNow(pskd = joinerInfo->second.mPSKd);
    }

    // Check if all joiners has been enabled.
    joinerInfo = mJoiners.find({JoinerType::kMeshCoP, Commissioner::ComputeJoinerId(0)});
    if (joinerInfo != mJoiners.end())
    {
        ExitNow(pskd = joinerInfo->second.mPSKd);
    }

exit:
    return pskd;
}